

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

value_type * __thiscall
pico_tree::internal::
chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::allocate
          (chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL> *this)

{
  chunk *pcVar1;
  size_t sVar2;
  
  sVar2 = this->object_index_;
  if (sVar2 == 0x100) {
    pcVar1 = list_pool_resource<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::
             allocate(&this->resource_);
    this->chunk_ = pcVar1;
    sVar2 = 0;
  }
  else {
    pcVar1 = this->chunk_;
  }
  this->object_index_ = sVar2 + 1;
  return pcVar1->_M_elems + sVar2;
}

Assistant:

inline value_type* allocate() {
    if (object_index_ == ChunkSize_) {
      chunk_ = resource_.allocate();
      object_index_ = 0;
    }

    value_type* object = &(*chunk_)[object_index_];
    object_index_++;

    return object;
  }